

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldBaseTestCase.cpp
# Opt level: O2

void __thiscall
SuiteFieldBaseTests::TestStringField_ComparisonIsLessThanOrEqualTo::RunImpl
          (TestStringField_ComparisonIsLessThanOrEqualTo *this)

{
  string *__lhs;
  TestResults *pTVar1;
  bool bVar2;
  TestResults **ppTVar3;
  TestDetails **ppTVar4;
  allocator<char> local_91;
  TestDetails local_90;
  StringField stringField;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"string",&local_91);
  FIX::StringField::StringField(&stringField,1,(string *)&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  __lhs = &stringField.super_FieldBase.m_string;
  bVar2 = std::operator<=(__lhs,"string");
  if (!bVar2) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_90,*ppTVar4,0x4b);
    UnitTest::TestResults::OnTestFailure(pTVar1,&local_90,"stringField <= \"string\"");
  }
  bVar2 = std::operator<=(__lhs,"string_long");
  if (!bVar2) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_90,*ppTVar4,0x4c);
    UnitTest::TestResults::OnTestFailure(pTVar1,&local_90,"stringField <= \"string_long\"");
  }
  bVar2 = std::operator<=(__lhs,"str");
  if (bVar2) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_90,*ppTVar4,0x4d);
    UnitTest::TestResults::OnTestFailure(pTVar1,&local_90,"!(stringField <= \"str\")");
  }
  FIX::FieldBase::~FieldBase(&stringField.super_FieldBase);
  return;
}

Assistant:

TEST(StringField_ComparisonIsLessThanOrEqualTo){
  StringField stringField(1, "string");
  CHECK(stringField <= "string");
  CHECK(stringField <= "string_long");
  CHECK(!(stringField <= "str"));
}